

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall
leveldb::DBImpl::CompactionState::CompactionState(CompactionState *this,Compaction *c)

{
  Compaction *c_local;
  CompactionState *this_local;
  
  this->compaction = c;
  this->smallest_snapshot = 0;
  std::
  vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  ::vector(&this->outputs);
  this->outfile = (WritableFile *)0x0;
  this->builder = (TableBuilder *)0x0;
  this->total_bytes = 0;
  return;
}

Assistant:

explicit CompactionState(Compaction* c)
      : compaction(c),
        smallest_snapshot(0),
        outfile(nullptr),
        builder(nullptr),
        total_bytes(0) {}